

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  EdgeControlSpecifierSyntax *pEVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *in_stack_00000110;
  
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::EdgeDescriptorSyntax>(in_stack_00000110,in_stack_00000108);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EdgeControlSpecifierSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (Token *)TVar3.info);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EdgeControlSpecifierSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EdgeControlSpecifierSyntax>(
        node.openBracket.deepClone(alloc),
        *deepClone(node.descriptors, alloc),
        node.closeBracket.deepClone(alloc)
    );
}